

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modelbin.cpp
# Opt level: O0

Mat * __thiscall ncnn::ModelBin::load(ModelBin *this,int w,int h,int c,int type)

{
  bool bVar1;
  int in_ECX;
  int in_EDX;
  long *in_RSI;
  Mat *in_RDI;
  int in_R8D;
  undefined4 in_R9D;
  Allocator *in_stack_00000010;
  int in_stack_0000001c;
  int in_stack_00000020;
  int in_stack_00000024;
  Mat *in_stack_00000028;
  Mat m;
  Mat *this_00;
  Mat local_60;
  
  this_00 = in_RDI;
  (**(code **)(*in_RSI + 0x10))(&local_60,in_RSI,in_EDX * in_ECX * in_R8D,in_R9D);
  bVar1 = ncnn::Mat::empty(this_00);
  if (bVar1) {
    ncnn::Mat::Mat(this_00,&local_60);
  }
  else {
    ncnn::Mat::reshape(in_stack_00000028,in_stack_00000024,in_stack_00000020,in_stack_0000001c,
                       in_stack_00000010);
  }
  ncnn::Mat::~Mat((Mat *)0x16581d);
  return in_RDI;
}

Assistant:

Mat ModelBin::load(int w, int h, int c, int type) const
{
    Mat m = load(w * h * c, type);
    if (m.empty())
        return m;

    return m.reshape(w, h, c);
}